

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void run_container_append(run_container_t *run,rle16_t vl,rle16_t *previousrl)

{
  ushort uVar1;
  int iVar2;
  rle16_t *prVar3;
  uint uVar4;
  
  uVar1 = previousrl->value;
  if ((uint)previousrl->length + (uint)uVar1 + 1 < ((uint)vl & 0xffff)) {
    prVar3 = run->runs;
    iVar2 = run->n_runs;
    prVar3[iVar2].value = vl.value;
    prVar3[iVar2].length = vl.length;
    run->n_runs = iVar2 + 1;
    previousrl->value = vl.value;
    previousrl->length = vl.length;
    return;
  }
  uVar4 = ((uint)vl & 0xffff) + ((uint)vl >> 0x10);
  if ((uint)previousrl->length + (uint)uVar1 <= uVar4) {
    previousrl->length = (short)uVar4 - uVar1;
    run->runs[(long)run->n_runs + -1] = *previousrl;
  }
  return;
}

Assistant:

static inline void run_container_append(run_container_t *run, rle16_t vl,
                                        rle16_t *previousrl) {
    const uint32_t previousend = previousrl->value + previousrl->length;
    if (vl.value > previousend + 1) {  // we add a new one
        run->runs[run->n_runs] = vl;
        run->n_runs++;
        *previousrl = vl;
    } else {
        uint32_t newend = vl.value + vl.length + UINT32_C(1);
        if (newend > previousend) {  // we merge
            previousrl->length = (uint16_t)(newend - 1 - previousrl->value);
            run->runs[run->n_runs - 1] = *previousrl;
        }
    }
}